

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* __thiscall duckdb_re2::RE2::NamedCapturingGroups_abi_cxx11_(RE2 *this)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined1 local_39;
  RE2 *local_38;
  undefined1 *local_30;
  RE2 **local_28;
  
  local_28 = &local_38;
  local_30 = &local_39;
  local_38 = this;
  plVar2 = (long *)__tls_get_addr(&PTR_024dae48);
  *plVar2 = (long)&local_30;
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_024d04a0);
  *puVar3 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar1 = pthread_once(&(this->named_groups_once_)._M_once,__once_proxy);
  if (iVar1 == 0) {
    *plVar2 = 0;
    *puVar3 = 0;
    return this->named_groups_;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

const std::map<std::string, int>& RE2::NamedCapturingGroups() const {
  std::call_once(named_groups_once_, [](const RE2* re) {
    if (re->suffix_regexp_ != NULL)
      re->named_groups_ = re->suffix_regexp_->NamedCaptures();
    if (re->named_groups_ == NULL)
      re->named_groups_ = empty_named_groups();
  }, this);
  return *named_groups_;
}